

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O0

EVstone INT_EVcreate_immediate_action(CManager_conflict cm,char *action_spec,EVstone *target_list)

{
  uint uVar1;
  EVstone EVar2;
  EVaction stone_num;
  long in_RDX;
  CManager_conflict in_RSI;
  EVaction action;
  EVstone stone;
  int i;
  uint in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int iVar3;
  
  iVar3 = 0;
  EVar2 = INT_EValloc_stone(in_RSI);
  stone_num = EVassoc_immediate_action
                        (in_RSI,(EVstone)((ulong)in_RDX >> 0x20),(char *)CONCAT44(iVar3,EVar2),
                         (void *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  while( true ) {
    uVar1 = in_stack_ffffffffffffffd8 & 0xffffff;
    if (in_RDX != 0) {
      uVar1 = CONCAT13(*(int *)(in_RDX + (long)iVar3 * 4) != 0,(int3)in_stack_ffffffffffffffd8);
    }
    in_stack_ffffffffffffffd8 = uVar1;
    if ((char)(in_stack_ffffffffffffffd8 >> 0x18) == '\0') break;
    INT_EVaction_set_output
              ((CManager_conflict)CONCAT44(iVar3,EVar2),stone_num,in_stack_ffffffffffffffd8,0,
               0x13d775);
    iVar3 = iVar3 + 1;
  }
  return EVar2;
}

Assistant:

EVstone
INT_EVcreate_immediate_action(CManager cm, char *action_spec, 
			      EVstone *target_list)
{
    int i = 0;
    EVstone stone = INT_EValloc_stone(cm);
    EVaction action = EVassoc_immediate_action(cm, stone, action_spec, NULL);
    while (target_list && (target_list[i] != 0)) {
	INT_EVaction_set_output(cm, stone, action, i, target_list[i]);
	i++;
    }
    return stone;
}